

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cpp
# Opt level: O0

void libcellml::updateComponentsVariablesUnitsNames
               (string *name,ComponentPtr *component,UnitsPtr *units)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  bool bVar2;
  __type _Var3;
  element_type *peVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  string *name_00;
  element_type *this;
  element_type *peVar6;
  undefined1 local_110 [8];
  ComponentPtr childComponent;
  size_t index;
  string local_e8;
  string local_c8;
  undefined1 local_a8 [16];
  string local_98;
  undefined1 local_78 [8];
  ComponentPtr importComponent;
  ModelPtr importModel;
  VariablePtr variable;
  size_t variableIndex;
  UnitsPtr *units_local;
  ComponentPtr *component_local;
  string *name_local;
  
  variable.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  while( true ) {
    _Var1._M_pi = variable.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    peVar4 = std::
             __shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)component);
    p_Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)Component::variableCount(peVar4);
    if (p_Var5 <= _Var1._M_pi) break;
    peVar4 = std::
             __shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)component);
    Component::variable((Component *)&stack0xffffffffffffffc8,(size_t)peVar4);
    peVar4 = std::
             __shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)component);
    bVar2 = ImportedEntity::isImport(&peVar4->super_ImportedEntity);
    if (bVar2) {
      std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)component);
      ImportedEntity::importSource
                ((ImportedEntity *)
                 &importComponent.
                  super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::__shared_ptr_access<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)&importComponent.
                     super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount);
      ImportSource::model((ImportSource *)&stack0xffffffffffffffa8);
      std::shared_ptr<libcellml::ImportSource>::~shared_ptr
                ((shared_ptr<libcellml::ImportSource> *)
                 &importComponent.
                  super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      name_00 = (string *)
                std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&stack0xffffffffffffffa8);
      peVar4 = std::
               __shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)component);
      ImportedEntity::importReference_abi_cxx11_
                ((string *)(local_a8 + 0x10),&peVar4->super_ImportedEntity);
      ComponentEntity::component
                ((ComponentEntity *)local_78,name_00,(bool)((char)local_a8 + '\x10'));
      std::__cxx11::string::~string((string *)(local_a8 + 0x10));
      peVar4 = std::
               __shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_78);
      peVar6 = std::
               __shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&stack0xffffffffffffffc8);
      NamedEntity::name_abi_cxx11_(&local_c8,&peVar6->super_NamedEntity);
      Component::variable((Component *)local_a8,(string *)peVar4);
      std::shared_ptr<libcellml::Variable>::operator=
                ((shared_ptr<libcellml::Variable> *)&stack0xffffffffffffffc8,
                 (shared_ptr<libcellml::Variable> *)local_a8);
      std::shared_ptr<libcellml::Variable>::~shared_ptr((shared_ptr<libcellml::Variable> *)local_a8)
      ;
      std::__cxx11::string::~string((string *)&local_c8);
      std::shared_ptr<libcellml::Component>::~shared_ptr
                ((shared_ptr<libcellml::Component> *)local_78);
      std::shared_ptr<libcellml::Model>::~shared_ptr
                ((shared_ptr<libcellml::Model> *)&stack0xffffffffffffffa8);
    }
    std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
               )&stack0xffffffffffffffc8);
    Variable::units((Variable *)&index);
    this = std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&index);
    NamedEntity::name_abi_cxx11_(&local_e8,&this->super_NamedEntity);
    _Var3 = std::operator==(&local_e8,name);
    std::__cxx11::string::~string((string *)&local_e8);
    std::shared_ptr<libcellml::Units>::~shared_ptr((shared_ptr<libcellml::Units> *)&index);
    if (_Var3) {
      peVar6 = std::
               __shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&stack0xffffffffffffffc8);
      Variable::setUnits(peVar6,units);
    }
    std::shared_ptr<libcellml::Variable>::~shared_ptr
              ((shared_ptr<libcellml::Variable> *)&stack0xffffffffffffffc8);
    variable.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         ((long)&(variable.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_vptr__Sp_counted_base + 1);
  }
  childComponent.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  while( true ) {
    _Var1._M_pi = childComponent.
                  super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi;
    peVar4 = std::
             __shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)component);
    p_Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             ComponentEntity::componentCount(&peVar4->super_ComponentEntity);
    if (p_Var5 <= _Var1._M_pi) break;
    peVar4 = std::
             __shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)component);
    ComponentEntity::component((ComponentEntity *)local_110,(size_t)peVar4);
    updateComponentsVariablesUnitsNames(name,(ComponentPtr *)local_110,units);
    std::shared_ptr<libcellml::Component>::~shared_ptr
              ((shared_ptr<libcellml::Component> *)local_110);
    childComponent.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            ((long)&(childComponent.
                     super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi)->_vptr__Sp_counted_base + 1);
  }
  return;
}

Assistant:

void updateComponentsVariablesUnitsNames(const std::string &name, const ComponentPtr &component, const UnitsPtr &units)
{
    for (size_t variableIndex = 0; variableIndex < component->variableCount(); ++variableIndex) {
        auto variable = component->variable(variableIndex);
        if (component->isImport()) {
            auto importModel = component->importSource()->model();
            auto importComponent = importModel->component(component->importReference());
            variable = importComponent->variable(variable->name());
        }
        if (variable->units()->name() == name) {
            variable->setUnits(units);
        }
    }
    for (size_t index = 0; index < component->componentCount(); ++index) {
        auto childComponent = component->component(index);
        updateComponentsVariablesUnitsNames(name, childComponent, units);
    }
}